

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_cf_set_earlydata(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t blen)

{
  CURLcode local_44;
  ssize_t sStack_40;
  CURLcode result;
  ssize_t nwritten;
  ssl_connect_data *connssl;
  size_t blen_local;
  void *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  nwritten = (ssize_t)cf->ctx;
  sStack_40 = 0;
  local_44 = CURLE_OK;
  if (blen != 0) {
    connssl = (ssl_connect_data *)blen;
    if (*(ulong *)(nwritten + 0xa8) < blen) {
      connssl = *(ssl_connect_data **)(nwritten + 0xa8);
    }
    blen_local = (size_t)buf;
    buf_local = data;
    data_local = (Curl_easy *)cf;
    sStack_40 = Curl_bufq_write((bufq *)(nwritten + 0x68),(uchar *)buf,(size_t)connssl,&local_44);
    if ((((buf_local != (void *)0x0) && ((*(ulong *)((long)buf_local + 0xa2c) >> 0x1e & 1) != 0)) &&
        ((*(long *)((long)buf_local + 0x1310) == 0 ||
         (0 < *(int *)(*(long *)((long)buf_local + 0x1310) + 8))))) &&
       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)buf_local,(Curl_cfilter *)data_local,
                        "ssl_cf_set_earlydata(len=%zu) -> %zd",connssl,sStack_40);
    }
    if (sStack_40 < 0) {
      return local_44;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ssl_cf_set_earlydata(struct Curl_cfilter *cf,
                                     struct Curl_easy *data,
                                     const void *buf, size_t blen)
{
  struct ssl_connect_data *connssl = cf->ctx;
  ssize_t nwritten = 0;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(connssl->earlydata_state == ssl_earlydata_await);
  DEBUGASSERT(Curl_bufq_is_empty(&connssl->earlydata));
  if(blen) {
    if(blen > connssl->earlydata_max)
      blen = connssl->earlydata_max;
    nwritten = Curl_bufq_write(&connssl->earlydata, buf, blen, &result);
    CURL_TRC_CF(data, cf, "ssl_cf_set_earlydata(len=%zu) -> %zd",
                blen, nwritten);
    if(nwritten < 0)
      return result;
  }
  return CURLE_OK;
}